

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-iter.c
# Opt level: O1

_Bool bson_iter_find_descendant(bson_iter_t *iter,char *dotkey,bson_iter_t *descendant)

{
  uint8_t **ppuVar1;
  size_t *psVar2;
  long *plVar3;
  uint8_t uVar4;
  size_t sVar5;
  ulong uVar6;
  double dVar7;
  long lVar8;
  int64_t iVar9;
  bool bVar10;
  _Bool _Var11;
  undefined1 extraout_AL;
  undefined1 uVar12;
  char cVar13;
  bson_type_t bVar14;
  uint uVar15;
  char *pcVar16;
  size_t sVar17;
  void *pvVar18;
  undefined8 uVar19;
  code *pcVar20;
  bson_oid_t *pbVar21;
  char *__s;
  size_t nbytes;
  ulong uVar22;
  uint uVar23;
  uint uVar24;
  uint32_t uVar25;
  ulong *in_RCX;
  long lVar26;
  uint8_t *puVar27;
  ulong uVar28;
  int iVar29;
  uint uVar30;
  int32_t iVar31;
  uint *extraout_RDX;
  int *extraout_RDX_00;
  undefined4 *extraout_RDX_01;
  ulong *extraout_RDX_02;
  undefined4 *extraout_RDX_03;
  undefined8 extraout_RDX_04;
  bson_error_t *error;
  size_t __n;
  bson_iter_t *unaff_RBX;
  bson_json_destroy_cb p_Var32;
  anon_union_24_17_78d57918_for_value *dst;
  bson_json_reader_cb num_bytes;
  bson_error_t *__s_00;
  uint8_t *puVar33;
  bson_t *pbVar34;
  uint uVar35;
  uint uVar36;
  char *unaff_R12;
  uint uVar37;
  bool bVar38;
  byte bVar39;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  bson_iter_t tmp;
  bson_error_t bStack_660;
  bson_iter_t *pbStack_460;
  char *pcStack_458;
  uint32_t uStack_3a0;
  _Bool _Stack_399;
  bson_t *pbStack_398;
  uint32_t uStack_390;
  uint32_t uStack_38c;
  uint8_t *puStack_388;
  char *apcStack_380 [45];
  bson_iter_t *pbStack_218;
  char *pcStack_210;
  bson_iter_t local_100 [2];
  
  bVar39 = 0;
  if (iter == (bson_iter_t *)0x0) {
    bson_iter_find_descendant_cold_3();
LAB_00110b9b:
    bson_iter_find_descendant_cold_2();
  }
  else {
    unaff_R12 = dotkey;
    if (dotkey == (char *)0x0) goto LAB_00110b9b;
    unaff_RBX = descendant;
    if (descendant != (bson_iter_t *)0x0) {
      pcVar16 = strchr(dotkey,0x2e);
      if (pcVar16 == (char *)0x0) {
        sVar17 = strlen(dotkey);
        iVar29 = (int)sVar17;
      }
      else {
        iVar29 = (int)pcVar16 - (int)dotkey;
      }
      _Var11 = _bson_iter_find_with_len(iter,dotkey,iVar29);
      if (_Var11) {
        if (pcVar16 == (char *)0x0) {
          for (lVar26 = 10; lVar26 != 0; lVar26 = lVar26 + -1) {
            descendant->raw = iter->raw;
            iter = (bson_iter_t *)((long)iter + (ulong)bVar39 * -0x10 + 8);
            descendant = (bson_iter_t *)((long)descendant + (ulong)bVar39 * -0x10 + 8);
          }
          return true;
        }
        bVar14 = bson_iter_type(iter);
        if (((bVar14 == BSON_TYPE_DOCUMENT) ||
            (bVar14 = bson_iter_type(iter), bVar14 == BSON_TYPE_ARRAY)) &&
           (puVar33 = iter->raw, (byte)(puVar33[iter->type] - 3) < 2)) {
          local_100[0].raw = puVar33 + iter->d1;
          local_100[0].len = *(uint32_t *)(puVar33 + iter->d1);
          local_100[0].off = 0;
          local_100[0].type = 0;
          local_100[0].key = 0;
          local_100[0].d1 = 0;
          local_100[0].d2 = 0;
          local_100[0].d3 = 0;
          local_100[0].d4 = 0;
          local_100[0].next_off = 4;
          local_100[0].err_off = 0;
          _Var11 = bson_iter_find_descendant(local_100,pcVar16 + 1,descendant);
          return _Var11;
        }
      }
      return false;
    }
  }
  bson_iter_find_descendant_cold_1();
  if ((bson_json_reader_t *)iter == (bson_json_reader_t *)0x0) {
    bson_iter_type_cold_3();
LAB_00110bc7:
    bson_iter_type_cold_2();
  }
  else {
    puVar33 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar33 == (uint8_t *)0x0) goto LAB_00110bc7;
    if (*(uint32_t *)&(((bson_json_reader_t *)iter)->producer).cb != 0) {
      return (_Bool)puVar33[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb];
    }
  }
  bson_iter_type_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    *(undefined1 *)in_RCX = 0;
    puVar33 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar33 == (uint8_t *)0x0) {
      ((bson_t *)dotkey)->flags = 0;
      ((bson_t *)dotkey)->len = 0;
      *extraout_RDX = 0;
      bVar39 = 0;
      goto LAB_00110e9c;
    }
    uVar37 = *(uint *)&(((bson_json_reader_t *)iter)->producer).cb;
    uVar24 = (uint)(((bson_json_reader_t *)iter)->producer).bytes_read;
    *(uint *)((long)&(((bson_json_reader_t *)iter)->producer).cb + 4) = uVar24;
    *(uint *)&(((bson_json_reader_t *)iter)->producer).dcb = uVar24;
    *(uint *)((long)&(((bson_json_reader_t *)iter)->producer).dcb + 4) = uVar24 + 1;
    ppuVar1 = &(((bson_json_reader_t *)iter)->producer).buf;
    (((bson_json_reader_t *)iter)->producer).buf = (uint8_t *)0x0;
    (((bson_json_reader_t *)iter)->producer).buf_size = 0;
    uVar28 = (ulong)uVar24;
    do {
      iVar29 = (int)uVar28;
      uVar15 = iVar29 + 1;
      uVar28 = (ulong)uVar15;
      if (uVar37 <= uVar15) goto LAB_00110e8d;
    } while (puVar33[uVar15] != '\0');
    uVar35 = iVar29 + 2;
    *(uint *)&(((bson_json_reader_t *)iter)->producer).buf = uVar35;
    *(uint8_t **)dotkey = puVar33 + (uVar24 + 1);
    puVar27 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    bVar39 = puVar27[uVar24];
    *extraout_RDX = (uint)bVar39;
    uVar24 = uVar35;
    if (0x13 < bVar39) {
      if ((bVar39 == 0x7f) || (bVar39 == 0xff)) goto switchD_00110c4f_caseD_6;
      *(undefined1 *)in_RCX = 1;
      goto switchD_00110c4f_caseD_0;
    }
    uVar23 = iVar29 + 3;
    switch(bVar39) {
    case 0:
      break;
    default:
      uVar23 = iVar29 + 10;
      goto LAB_00110c87;
    case 2:
    case 0xd:
    case 0xe:
      uVar23 = iVar29 + 6;
      if (uVar23 < uVar37) {
        *(uint *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4) = uVar23;
        uVar30 = *(uint *)(puVar27 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
        if (uVar30 <= (uVar37 - uVar15) - 5) {
          uVar36 = uVar30 + uVar15 + 5;
          *(uint *)&(((bson_json_reader_t *)iter)->producer).bytes_read = uVar36;
          if (uVar30 != 0) {
            if (uVar36 < uVar37) {
              if (puVar27[(ulong)(uVar30 - 1) + (ulong)uVar23] == '\0') goto LAB_00110c8a;
              uVar24 = uVar30 + uVar15 + 4;
            }
            goto LAB_00110e8a;
          }
        }
      }
      break;
    case 3:
    case 4:
      if ((uVar35 < uVar37 - 4) &&
         (uVar23 = *(uint *)(puVar27 + *(uint *)ppuVar1), uVar23 <= uVar37)) {
        if (~uVar15 + uVar37 < uVar23) goto LAB_00110e8a;
        uVar23 = uVar23 + uVar15 + 1;
        goto LAB_00110c87;
      }
      break;
    case 5:
      if (uVar35 < uVar37 - 4) {
        *(uint *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4) = iVar29 + 6U;
        uVar23 = iVar29 + 7;
        *(uint *)&(((bson_json_reader_t *)iter)->producer).buf_size = uVar23;
        uVar24 = *(uint *)(puVar27 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
        if (~uVar15 + uVar37 <= uVar24) goto LAB_00110f00;
        if (puVar27[iVar29 + 6U] == '\x02') {
          uVar30 = uVar35;
          if ((uVar24 < 4) || (uVar30 = uVar23, *(int *)(puVar27 + uVar23) + 4U != uVar24)) {
            *(uint *)((long)&(((bson_json_reader_t *)iter)->producer).bytes_read + 4) = uVar30;
            bVar38 = true;
            bVar10 = false;
          }
          else {
            bVar38 = false;
            bVar10 = true;
          }
          if (bVar10) goto LAB_00110f84;
        }
        else {
LAB_00110f84:
          uVar24 = uVar15 + uVar24 + 6;
          uVar28 = (ulong)uVar24;
          *(uint *)&(((bson_json_reader_t *)iter)->producer).bytes_read = uVar24;
          bVar38 = false;
        }
      }
      else {
LAB_00110f00:
        *(uint *)((long)&(((bson_json_reader_t *)iter)->producer).bytes_read + 4) = uVar35;
        bVar38 = true;
      }
      bVar39 = (byte)uVar28;
      if (bVar38) goto LAB_00110e8d;
      if (bVar38) goto LAB_00110e9c;
      goto LAB_00110c8a;
    case 6:
    case 10:
switchD_00110c4f_caseD_6:
      *(uint32_t *)ppuVar1 = 0xffffffff;
      uVar23 = uVar35;
      goto LAB_00110c87;
    case 7:
      uVar23 = iVar29 + 0xe;
      goto LAB_00110c87;
    case 8:
      if ((*(uint *)ppuVar1 < uVar37) && (puVar27[*(uint *)ppuVar1] < 2)) goto LAB_00110c87;
      break;
    case 0xb:
      bVar38 = uVar35 < uVar37;
      if (bVar38) {
        if (puVar33[uVar35] != '\0') {
          uVar28 = (ulong)uVar23;
          do {
            bVar38 = (uint)uVar28 < uVar37;
            uVar24 = uVar37;
            if (!bVar38) goto LAB_00110f1f;
            uVar35 = uVar35 + 1;
            puVar27 = puVar33 + uVar28;
            uVar28 = uVar28 + 1;
          } while (*puVar27 != '\0');
        }
        *(uint *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4) = uVar35 + 1;
        uVar24 = uVar35 + 1;
      }
LAB_00110f1f:
      uVar35 = uVar24;
      if ((bVar38) && (uVar24 < uVar37)) {
        do {
          if (puVar33[uVar24] == '\0') {
            *(uint *)&(((bson_json_reader_t *)iter)->producer).bytes_read = uVar24 + 1;
            bVar38 = true;
            uVar35 = uVar24;
            goto LAB_00110f45;
          }
          uVar24 = uVar24 + 1;
          uVar35 = uVar37;
        } while (uVar37 != uVar24);
      }
      *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).bytes_read + 4) =
           (uint32_t)(((bson_json_reader_t *)iter)->producer).bytes_read;
      bVar38 = false;
LAB_00110f45:
      if (bVar38) goto LAB_00110c8a;
      goto LAB_00110e8d;
    case 0xc:
      if (uVar35 < uVar37 - 4) {
        *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4) = iVar29 + 6;
        uVar23 = *(uint *)(puVar27 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
        if (((ulong)uVar23 != 0) && (uVar23 <= (uVar37 - uVar15) - 5)) {
          if (puVar27[(ulong)uVar23 + 3 + (ulong)uVar35] != '\0') {
            uVar24 = uVar23 + uVar15 + 4;
            goto LAB_00110e8a;
          }
          *(uint *)&(((bson_json_reader_t *)iter)->producer).buf_size = uVar23 + uVar15 + 5;
          uVar23 = uVar23 + uVar15 + 0x11;
          goto LAB_00110c87;
        }
      }
      break;
    case 0xf:
      if (uVar37 < 0x13) break;
      if (uVar35 < uVar37 - 0xe) {
        uVar30 = iVar29 + 6;
        *(uint *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4) = uVar30;
        *(uint32_t *)&(((bson_json_reader_t *)iter)->producer).buf_size = iVar29 + 10;
        uVar23 = *(uint *)(puVar27 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
        if ((0xd < uVar23) && (uVar23 < ~uVar15 + uVar37)) {
          uVar23 = uVar23 + uVar15 + 1;
          *(uint *)&(((bson_json_reader_t *)iter)->producer).bytes_read = uVar23;
          if ((uVar23 < uVar37) && (uVar36 = *(uint *)(puVar27 + uVar30), uVar36 != 0)) {
            if ((uVar36 < (uVar37 - uVar15) - 9) &&
               (uVar24 = uVar30, uVar36 + uVar15 + 0xd < uVar23)) {
              uVar24 = uVar36 + uVar15 + 9;
              *(uint *)((long)&(((bson_json_reader_t *)iter)->producer).buf_size + 4) = uVar24;
              if (uVar23 == uVar15 + uVar36 + *(int *)(puVar27 + uVar24) + 9) goto LAB_00110c8a;
            }
            goto LAB_00110e8a;
          }
        }
        break;
      }
      goto LAB_00110e8a;
    case 0x10:
      uVar23 = iVar29 + 6;
      goto LAB_00110c87;
    case 0x13:
      uVar23 = iVar29 + 0x12;
LAB_00110c87:
      *(uint *)&(((bson_json_reader_t *)iter)->producer).bytes_read = uVar23;
LAB_00110c8a:
      uVar24 = uVar35;
      if ((uint)(((bson_json_reader_t *)iter)->producer).bytes_read < uVar37) {
        *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).bytes_read + 4) = 0;
        bVar39 = 1;
        goto LAB_00110e9c;
      }
      goto LAB_00110e8a;
    }
switchD_00110c4f_caseD_0:
LAB_00110e8a:
    *(uint *)((long)&(((bson_json_reader_t *)iter)->producer).bytes_read + 4) = uVar24;
LAB_00110e8d:
    (((bson_json_reader_t *)iter)->producer).data = (uint8_t *)0x0;
    bVar39 = 0;
    *(uint32_t *)&(((bson_json_reader_t *)iter)->producer).cb = 0;
    *(uint32_t *)&(((bson_json_reader_t *)iter)->producer).bytes_read = 0;
LAB_00110e9c:
    return (_Bool)(bVar39 & 1);
  }
  _bson_iter_next_internal_cold_1();
  if ((bson_json_reader_t *)iter == (bson_json_reader_t *)0x0) {
    bson_iter_binary_cold_2();
  }
  else if (extraout_RDX_00 != (int *)0x0 || in_RCX == (ulong *)0x0) {
    puVar33 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar33[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x05') {
      uVar37 = (uint)puVar33[*(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4)]
      ;
      if ((bson_t *)dotkey != (bson_t *)0x0) {
        ((bson_t *)dotkey)->flags =
             (uint)puVar33[*(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4)];
      }
      if (in_RCX != (ulong *)0x0) {
        iVar29 = *(int *)(puVar33 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
        *extraout_RDX_00 = iVar29;
        puVar33 = (uint8_t *)
                  ((long)(((bson_json_reader_t *)iter)->producer).data +
                  (ulong)(uint)(((bson_json_reader_t *)iter)->producer).buf_size);
        *in_RCX = (ulong)puVar33;
        if ((bson_t *)dotkey != (bson_t *)0x0) {
          uVar37 = ((bson_t *)dotkey)->flags;
        }
        if (uVar37 == 2) {
          *extraout_RDX_00 = iVar29 + -4;
          *in_RCX = (ulong)(puVar33 + 4);
        }
      }
    }
    else {
      if (in_RCX != (ulong *)0x0) {
        *in_RCX = 0;
      }
      if (extraout_RDX_00 != (int *)0x0) {
        *extraout_RDX_00 = 0;
      }
      if ((bson_t *)dotkey != (bson_t *)0x0) {
        ((bson_t *)dotkey)->flags = 0;
      }
    }
    return (_Bool)extraout_AL;
  }
  bson_iter_binary_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar33 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar33[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\b') {
      return false;
    }
    return puVar33[*(uint *)&(((bson_json_reader_t *)iter)->producer).buf] != '\0';
  }
  bson_iter_bool_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar33 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    uVar4 = puVar33[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb];
    switch(uVar4) {
    case '\x01':
      return (_Bool)(-(*(double *)(puVar33 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)
                      != 0.0) & 1);
    case '\x02':
    case '\x03':
    case '\x04':
    case '\x05':
    case '\a':
    case '\t':
      return true;
    case '\x06':
    case '\n':
      return false;
    case '\b':
      bVar38 = puVar33[*(uint *)&(((bson_json_reader_t *)iter)->producer).buf] == '\0';
      break;
    default:
      if (uVar4 == '\x10') {
        bVar38 = *(int *)(puVar33 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) == 0;
      }
      else {
        if (uVar4 != '\x12') {
          return true;
        }
        bVar38 = *(long *)(puVar33 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) == 0;
      }
    }
    return !bVar38;
  }
  bson_iter_as_bool_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    return SUB81((((bson_json_reader_t *)iter)->producer).data,0);
  }
  bson_iter_double_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar33 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar33[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\x12') {
      return false;
    }
    return SUB81(*(undefined8 *)(puVar33 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf),0
                );
  }
  bson_iter_int64_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar33 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    uVar12 = 0;
    if (puVar33[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x10') {
      uVar12 = (undefined1)
               *(undefined4 *)(puVar33 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
    }
    return (_Bool)uVar12;
  }
  bson_iter_int32_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar33 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    bVar39 = puVar33[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb];
    _Var11 = SUB81(puVar33,0);
    if (bVar39 < 0x10) {
      if (bVar39 == 1) {
        return _Var11;
      }
      if ((bVar39 == 8) && (puVar33[*(uint *)&(((bson_json_reader_t *)iter)->producer).buf] != '\0')
         ) {
        return _Var11;
      }
    }
    else if ((bVar39 != 0x10) && (bVar39 == 0x12)) {
      return _Var11;
    }
    return _Var11;
  }
  bson_iter_as_double_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar33 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    bVar39 = puVar33[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb];
    uVar12 = 0;
    if (bVar39 < 0x10) {
      if (bVar39 == 1) {
        return SUB81((long)*(double *)
                            (puVar33 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf),0);
      }
      if (bVar39 == 8) {
        return puVar33[*(uint *)&(((bson_json_reader_t *)iter)->producer).buf] != '\0';
      }
    }
    else if (bVar39 == 0x10) {
      uVar12 = (undefined1)
               *(undefined4 *)(puVar33 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
    }
    else if (bVar39 == 0x12) {
      return SUB81(*(undefined8 *)(puVar33 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)
                   ,0);
    }
    return (_Bool)uVar12;
  }
  bson_iter_as_int64_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar33 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    uVar4 = puVar33[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb];
    if (uVar4 == '\x13') {
      plVar3 = (long *)(puVar33 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      lVar26 = *plVar3;
      lVar8 = plVar3[1];
      ((bson_t *)dotkey)->flags = (int)lVar26;
      ((bson_t *)dotkey)->len = (int)((ulong)lVar26 >> 0x20);
      *(long *)((bson_t *)dotkey)->padding = lVar8;
    }
    return uVar4 == '\x13';
  }
  bson_iter_decimal128_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar33 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar33[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\a') {
      return false;
    }
    return (_Bool)((char)puVar33 + (char)*(uint32_t *)&(((bson_json_reader_t *)iter)->producer).buf)
    ;
  }
  bson_iter_oid_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar33 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar33[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\v') {
      cVar13 = (char)*(uint32_t *)&(((bson_json_reader_t *)iter)->producer).buf + (char)puVar33;
      puVar33 = puVar33 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
    }
    else {
      cVar13 = '\0';
      puVar33 = (uint8_t *)0x0;
    }
    if ((bson_t *)dotkey != (bson_t *)0x0) {
      *(uint8_t **)dotkey = puVar33;
    }
    return (_Bool)cVar13;
  }
  bson_iter_regex_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar33 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar33[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\x02') {
      if ((bson_t *)dotkey != (bson_t *)0x0) {
        ((bson_t *)dotkey)->flags = 0;
      }
      return false;
    }
    if ((bson_t *)dotkey != (bson_t *)0x0) {
      iVar29 = 1;
      if (1 < *(int *)(puVar33 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)) {
        iVar29 = *(int *)(puVar33 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      }
      ((bson_t *)dotkey)->flags = iVar29 - 1;
    }
    return (_Bool)((char)puVar33 +
                  (char)*(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4));
  }
  bson_iter_utf8_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar33 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar33[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x02') {
      iVar29 = 1;
      if (1 < *(int *)(puVar33 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)) {
        iVar29 = *(int *)(puVar33 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      }
      uVar37 = iVar29 - 1;
      puVar33 = puVar33 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
    }
    else {
      uVar37 = 0;
      puVar33 = (uint8_t *)0x0;
    }
    if (puVar33 == (uint8_t *)0x0) {
      pvVar18 = (void *)0x0;
    }
    else {
      pvVar18 = bson_malloc0((ulong)(uVar37 + 1));
      memcpy(pvVar18,puVar33,(ulong)uVar37);
      *(undefined1 *)((long)pvVar18 + (ulong)uVar37) = 0;
    }
    if ((bson_t *)dotkey != (bson_t *)0x0) {
      ((bson_t *)dotkey)->flags = uVar37;
    }
    return SUB81(pvVar18,0);
  }
  bson_iter_dup_utf8_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar33 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar33[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\r') {
      if ((bson_t *)dotkey != (bson_t *)0x0) {
        ((bson_t *)dotkey)->flags = 0;
      }
      return false;
    }
    if ((bson_t *)dotkey != (bson_t *)0x0) {
      iVar29 = 1;
      if (1 < *(int *)(puVar33 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)) {
        iVar29 = *(int *)(puVar33 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      }
      ((bson_t *)dotkey)->flags = iVar29 - 1;
    }
    return (_Bool)((char)puVar33 +
                  (char)*(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4));
  }
  bson_iter_code_cold_1();
  if ((bson_json_reader_t *)iter == (bson_json_reader_t *)0x0) {
    bson_iter_codewscope_cold_2();
  }
  else {
    puVar33 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar33[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\x0f') {
      if ((bson_t *)dotkey != (bson_t *)0x0) {
        ((bson_t *)dotkey)->flags = 0;
      }
      if (extraout_RDX_01 != (undefined4 *)0x0) {
        *extraout_RDX_01 = 0;
      }
      if (in_RCX != (ulong *)0x0) {
        *in_RCX = 0;
      }
      return false;
    }
    if ((bson_t *)dotkey == (bson_t *)0x0) {
LAB_001113bb:
      *extraout_RDX_01 =
           *(undefined4 *)
            (puVar33 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf_size + 4));
      *in_RCX = (ulong)(puVar33 +
                       *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf_size + 4));
      return (_Bool)((char)(uint32_t)(((bson_json_reader_t *)iter)->producer).buf_size +
                    (char)(((bson_json_reader_t *)iter)->producer).data);
    }
    if (*(int *)(puVar33 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4))
        != 0) {
      ((bson_t *)dotkey)->flags =
           *(int *)(puVar33 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4)
                   ) - 1;
      goto LAB_001113bb;
    }
  }
  bson_iter_codewscope_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    if (extraout_RDX_02 != (ulong *)0x0) {
      *extraout_RDX_02 = 0;
    }
    if (in_RCX != (ulong *)0x0) {
      *in_RCX = 0;
    }
    puVar33 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar33[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\f') {
      if ((bson_t *)dotkey != (bson_t *)0x0) {
        uVar37 = *(uint *)(puVar33 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
        puVar33 = (uint8_t *)(ulong)uVar37;
        ((bson_t *)dotkey)->flags = uVar37;
        if (uVar37 != 0) {
          puVar33 = (uint8_t *)(ulong)(uVar37 - 1);
          ((bson_t *)dotkey)->flags = uVar37 - 1;
        }
      }
      if (extraout_RDX_02 != (ulong *)0x0) {
        puVar33 = (uint8_t *)
                  ((long)(((bson_json_reader_t *)iter)->producer).data +
                  (ulong)*(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4));
        *extraout_RDX_02 = (ulong)puVar33;
      }
      if (in_RCX != (ulong *)0x0) {
        puVar33 = (uint8_t *)
                  ((long)(((bson_json_reader_t *)iter)->producer).data +
                  (ulong)(uint)(((bson_json_reader_t *)iter)->producer).buf_size);
        *in_RCX = (ulong)puVar33;
      }
    }
    return SUB81(puVar33,0);
  }
  bson_iter_dbpointer_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar33 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar33[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x0e') {
      cVar13 = (char)*(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4) +
               (char)puVar33;
      iVar29 = 1;
      if (1 < *(int *)(puVar33 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)) {
        iVar29 = *(int *)(puVar33 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      }
      uVar25 = iVar29 - 1;
    }
    else {
      cVar13 = '\0';
      uVar25 = 0;
    }
    if ((bson_t *)dotkey != (bson_t *)0x0) {
      ((bson_t *)dotkey)->flags = uVar25;
    }
    return (_Bool)cVar13;
  }
  bson_iter_symbol_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar33 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar33[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\t') {
      return false;
    }
    return SUB81(*(undefined8 *)(puVar33 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf),0
                );
  }
  bson_iter_date_time_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar33 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar33[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\t') {
      return false;
    }
    return SUB81(*(ulong *)(puVar33 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) / 1000
                 ,0);
  }
  bson_iter_time_t_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar33 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    uVar25 = 0;
    uVar19 = 0;
    if (puVar33[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x11') {
      uVar19 = *(undefined8 *)(puVar33 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      uVar25 = (uint32_t)((ulong)uVar19 >> 0x20);
    }
    if ((bson_t *)dotkey != (bson_t *)0x0) {
      ((bson_t *)dotkey)->flags = uVar25;
    }
    if (extraout_RDX_03 != (undefined4 *)0x0) {
      *extraout_RDX_03 = (int)uVar19;
    }
    return SUB81(uVar19,0);
  }
  bson_iter_timestamp_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar33 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar33[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\t') {
      ((bson_t *)dotkey)->flags = 0;
      ((bson_t *)dotkey)->len = 0;
      ((bson_t *)dotkey)->padding[0] = '\0';
      ((bson_t *)dotkey)->padding[1] = '\0';
      ((bson_t *)dotkey)->padding[2] = '\0';
      ((bson_t *)dotkey)->padding[3] = '\0';
      ((bson_t *)dotkey)->padding[4] = '\0';
      ((bson_t *)dotkey)->padding[5] = '\0';
      ((bson_t *)dotkey)->padding[6] = '\0';
      ((bson_t *)dotkey)->padding[7] = '\0';
      return SUB81(puVar33,0);
    }
    lVar26 = *(long *)(puVar33 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
    *(long *)dotkey = lVar26 / 1000;
    lVar26 = (lVar26 % 1000) * 1000;
    *(long *)((bson_t *)dotkey)->padding = lVar26;
    return SUB81(lVar26,0);
  }
  bson_iter_timeval_cold_1();
  pbStack_218 = unaff_RBX;
  pcStack_210 = unaff_R12;
  if ((bson_json_reader_t *)iter == (bson_json_reader_t *)0x0) {
    bson_iter_visit_all_cold_2();
  }
  else if ((bson_t *)dotkey != (bson_t *)0x0) {
    _Var11 = _bson_iter_next_internal(iter,(char **)&puStack_388,&uStack_390,&_Stack_399);
    if (_Var11) {
      do {
        puVar33 = puStack_388;
        if (*puStack_388 != '\0') {
          sVar17 = strlen((char *)puStack_388);
          _Var11 = bson_utf8_validate((char *)puVar33,sVar17,false);
          if (!_Var11) {
            *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).bytes_read + 4) =
                 *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).cb + 4);
            break;
          }
        }
        if ((*(code **)dotkey != (code *)0x0) &&
           (cVar13 = (**(code **)dotkey)(iter,puVar33,extraout_RDX_04), cVar13 != '\0')) {
          return true;
        }
        switch(uStack_390) {
        case 1:
          pcVar20 = *(code **)(((bson_t *)dotkey)->padding + 0x10);
          if (pcVar20 == (code *)0x0) break;
          dVar7 = bson_iter_double(iter);
          cVar13 = (*pcVar20)(SUB84(dVar7,0),iter,puVar33,extraout_RDX_04);
          goto LAB_00111ad6;
        case 2:
          pcVar16 = bson_iter_utf8(iter,(uint32_t *)apcStack_380);
          _Var11 = bson_utf8_validate(pcVar16,(ulong)apcStack_380[0] & 0xffffffff,true);
          if (!_Var11) {
LAB_00111b8c:
            *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).bytes_read + 4) =
                 *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).cb + 4);
            return true;
          }
          pcVar20 = *(code **)(((bson_t *)dotkey)->padding + 0x18);
          goto LAB_001119f8;
        case 3:
          pbStack_398 = (bson_t *)0x0;
          uStack_3a0 = 0;
          bson_iter_document(iter,&uStack_3a0,(uint8_t **)&pbStack_398);
          _Var11 = bson_init_static((bson_t *)apcStack_380,(uint8_t *)pbStack_398,(ulong)uStack_3a0)
          ;
          if (_Var11) {
            pcVar20 = *(code **)(((bson_t *)dotkey)->padding + 0x20);
            goto LAB_00111a42;
          }
          break;
        case 4:
          pbStack_398 = (bson_t *)0x0;
          uStack_3a0 = 0;
          bson_iter_array(iter,&uStack_3a0,(uint8_t **)&pbStack_398);
          _Var11 = bson_init_static((bson_t *)apcStack_380,(uint8_t *)pbStack_398,(ulong)uStack_3a0)
          ;
          if (_Var11) {
            pcVar20 = *(code **)(((bson_t *)dotkey)->padding + 0x28);
            goto LAB_00111a42;
          }
          break;
        case 5:
          apcStack_380[0] = (char *)0x0;
          pbStack_398 = (bson_t *)((ulong)pbStack_398 & 0xffffffff00000000);
          uStack_3a0 = 0;
          bson_iter_binary(iter,(bson_subtype_t *)&pbStack_398,&uStack_3a0,(uint8_t **)apcStack_380)
          ;
          if (*(code **)(((bson_t *)dotkey)->padding + 0x30) != (code *)0x0) {
            cVar13 = (**(code **)(((bson_t *)dotkey)->padding + 0x30))
                               (iter,puVar33,(ulong)pbStack_398 & 0xffffffff,uStack_3a0,
                                apcStack_380[0],extraout_RDX_04);
            goto LAB_00111ad6;
          }
          break;
        case 6:
          pcVar20 = *(code **)(((bson_t *)dotkey)->padding + 0x38);
          goto LAB_001119ae;
        case 7:
          pcVar20 = *(code **)(((bson_t *)dotkey)->padding + 0x40);
          if (pcVar20 != (code *)0x0) {
            pbVar21 = bson_iter_oid(iter);
LAB_00111ac7:
            cVar13 = (*pcVar20)(iter,puVar33,pbVar21,extraout_RDX_04);
            goto LAB_00111ad6;
          }
          break;
        case 8:
          pcVar20 = *(code **)(((bson_t *)dotkey)->padding + 0x48);
          if (pcVar20 != (code *)0x0) {
            _Var11 = bson_iter_bool(iter);
            uVar37 = (uint)_Var11;
LAB_00111934:
            cVar13 = (*pcVar20)(iter,puVar33,uVar37,extraout_RDX_04);
            goto LAB_00111ad6;
          }
          break;
        case 9:
          pcVar20 = *(code **)(((bson_t *)dotkey)->padding + 0x50);
          if (pcVar20 != (code *)0x0) {
            pbVar21 = (bson_oid_t *)bson_iter_date_time(iter);
            goto LAB_00111ac7;
          }
          break;
        case 10:
          pcVar20 = *(code **)(((bson_t *)dotkey)->padding + 0x58);
LAB_001119ae:
          if (pcVar20 == (code *)0x0) break;
LAB_001119bd:
          cVar13 = (*pcVar20)(iter,puVar33,extraout_RDX_04);
          goto LAB_00111ad6;
        case 0xb:
          apcStack_380[0] = (char *)0x0;
          __s = bson_iter_regex(iter,apcStack_380);
          sVar17 = strlen(__s);
          _Var11 = bson_utf8_validate(__s,sVar17,true);
          if (!_Var11) goto LAB_00111b8c;
          pcVar20 = *(code **)(((bson_t *)dotkey)->padding + 0x60);
          pcVar16 = apcStack_380[0];
          if (pcVar20 == (code *)0x0) break;
          goto LAB_00111aaf;
        case 0xc:
          uStack_3a0 = 0;
          apcStack_380[0] = (char *)0x0;
          pbStack_398 = (bson_t *)0x0;
          bson_iter_dbpointer(iter,&uStack_3a0,apcStack_380,(bson_oid_t **)&pbStack_398);
          _Var11 = bson_utf8_validate(apcStack_380[0],(ulong)uStack_3a0,true);
          if (!_Var11) goto LAB_00111b8c;
          pcVar20 = *(code **)(((bson_t *)dotkey)->padding + 0x68);
          pcVar16 = apcStack_380[0];
          pbVar34 = pbStack_398;
          if (pcVar20 != (code *)0x0) {
LAB_001117cc:
            cVar13 = (*pcVar20)(iter,puVar33,uStack_3a0,pcVar16,pbVar34,extraout_RDX_04);
            goto LAB_00111ad6;
          }
          break;
        case 0xd:
          pcVar16 = bson_iter_code(iter,(uint32_t *)apcStack_380);
          _Var11 = bson_utf8_validate(pcVar16,(ulong)apcStack_380[0] & 0xffffffff,true);
          if (!_Var11) goto LAB_00111b8c;
          pcVar20 = *(code **)(((bson_t *)dotkey)->padding + 0x70);
          goto LAB_001119f8;
        case 0xe:
          pcVar16 = bson_iter_symbol(iter,(uint32_t *)apcStack_380);
          _Var11 = bson_utf8_validate(pcVar16,(ulong)apcStack_380[0] & 0xffffffff,true);
          if (!_Var11) goto LAB_00111b8c;
          pcVar20 = *(code **)((long)dotkey + 0x80);
LAB_001119f8:
          if (pcVar20 != (code *)0x0) {
            __s = (char *)((ulong)apcStack_380[0] & 0xffffffff);
LAB_00111aaf:
            cVar13 = (*pcVar20)(iter,puVar33,__s,pcVar16,extraout_RDX_04);
LAB_00111ad6:
            if (cVar13 != '\0') {
              return true;
            }
          }
          break;
        case 0xf:
          uStack_3a0 = 0;
          pbStack_398 = (bson_t *)0x0;
          uStack_38c = 0;
          pcVar16 = bson_iter_codewscope(iter,&uStack_3a0,&uStack_38c,(uint8_t **)&pbStack_398);
          _Var11 = bson_utf8_validate(pcVar16,(ulong)uStack_3a0,true);
          if (!_Var11) goto LAB_00111b8c;
          _Var11 = bson_init_static((bson_t *)apcStack_380,(uint8_t *)pbStack_398,(ulong)uStack_38c)
          ;
          if ((_Var11) &&
             (pcVar20 = *(code **)((bson_t *)((long)dotkey + 0x80))->padding, pcVar20 != (code *)0x0
             )) {
            pbVar34 = (bson_t *)apcStack_380;
            goto LAB_001117cc;
          }
          break;
        case 0x10:
          pcVar20 = *(code **)(((bson_t *)((long)dotkey + 0x80))->padding + 8);
          if (pcVar20 != (code *)0x0) {
            uVar37 = bson_iter_int32(iter);
            goto LAB_00111934;
          }
          break;
        case 0x11:
          bson_iter_timestamp(iter,(uint32_t *)apcStack_380,(uint32_t *)&pbStack_398);
          if (*(code **)(((bson_t *)((long)dotkey + 0x80))->padding + 0x10) != (code *)0x0) {
            cVar13 = (**(code **)(((bson_t *)((long)dotkey + 0x80))->padding + 0x10))
                               (iter,puVar33,(ulong)apcStack_380[0] & 0xffffffff,
                                (ulong)pbStack_398 & 0xffffffff,extraout_RDX_04);
            goto LAB_00111ad6;
          }
          break;
        case 0x12:
          pcVar20 = *(code **)(((bson_t *)((long)dotkey + 0x80))->padding + 0x18);
          if (pcVar20 != (code *)0x0) {
            pbVar21 = (bson_oid_t *)bson_iter_int64(iter);
            goto LAB_00111ac7;
          }
          break;
        case 0x13:
          bson_iter_decimal128(iter,(bson_decimal128_t *)apcStack_380);
          pcVar20 = *(code **)(((bson_t *)((long)dotkey + 0x80))->padding + 0x38);
LAB_00111a42:
          if (pcVar20 != (code *)0x0) {
            cVar13 = (*pcVar20)(iter,puVar33,(bson_t *)apcStack_380,extraout_RDX_04);
            goto LAB_00111ad6;
          }
          break;
        default:
          if (uStack_390 == 0x7f) {
            pcVar20 = *(code **)(((bson_t *)((long)dotkey + 0x80))->padding + 0x20);
          }
          else {
            if (uStack_390 != 0xff) break;
            pcVar20 = *(code **)(((bson_t *)((long)dotkey + 0x80))->padding + 0x28);
          }
          if (pcVar20 == (code *)0x0) break;
          puVar33 = (uint8_t *)
                    ((long)(((bson_json_reader_t *)iter)->producer).data +
                    (ulong)*(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).dcb + 4));
          goto LAB_001119bd;
        }
        if ((*(code **)((bson_t *)dotkey)->padding != (code *)0x0) &&
           (cVar13 = (**(code **)((bson_t *)dotkey)->padding)
                               (iter,(uint8_t *)
                                     ((long)(((bson_json_reader_t *)iter)->producer).data +
                                     (ulong)*(uint32_t *)
                                             ((long)&(((bson_json_reader_t *)iter)->producer).dcb +
                                             4)),extraout_RDX_04), cVar13 != '\0')) {
          return true;
        }
        _Var11 = _bson_iter_next_internal(iter,(char **)&puStack_388,&uStack_390,&_Stack_399);
      } while (_Var11);
    }
    if (*(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).bytes_read + 4) != 0) {
      if ((_Stack_399 == true) &&
         (*(long *)(((bson_t *)((long)dotkey + 0x80))->padding + 0x30) != 0)) {
        sVar17 = strlen((char *)puStack_388);
        _Var11 = bson_utf8_validate((char *)puStack_388,sVar17,false);
        if (_Var11) {
          (**(code **)(((bson_t *)((long)dotkey + 0x80))->padding + 0x30))
                    (iter,puStack_388,uStack_390,extraout_RDX_04);
          return false;
        }
      }
      if (*(code **)(((bson_t *)dotkey)->padding + 8) != (code *)0x0) {
        (**(code **)(((bson_t *)dotkey)->padding + 8))(iter,extraout_RDX_04);
      }
    }
    return false;
  }
  bson_iter_visit_all_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar33 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar33[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\b') {
      puVar33[*(uint *)&(((bson_json_reader_t *)iter)->producer).buf] = (uint8_t)dotkey;
    }
    return SUB81(puVar33,0);
  }
  bson_iter_overwrite_bool_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar33 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar33[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x10') {
      *(int *)(puVar33 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) = (int)dotkey;
    }
    return SUB81(puVar33,0);
  }
  bson_iter_overwrite_int32_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar33 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar33[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x12') {
      *(char **)(puVar33 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) = dotkey;
    }
    return SUB81(puVar33,0);
  }
  bson_iter_overwrite_int64_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar33 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar33[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x01') {
      *(ulong *)(puVar33 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) =
           CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
    }
    return SUB81(puVar33,0);
  }
  bson_iter_overwrite_double_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar33 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar33[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x13') {
      uVar37 = *(uint *)&(((bson_json_reader_t *)iter)->producer).buf;
      lVar26 = *(long *)((bson_t *)dotkey)->padding;
      *(long *)(puVar33 + uVar37) = *(long *)dotkey;
      *(long *)((long)(puVar33 + uVar37) + 8) = lVar26;
    }
    return SUB81(puVar33,0);
  }
  bson_iter_overwrite_decimal128_cold_1();
  if ((bson_json_reader_t *)iter == (bson_json_reader_t *)0x0) {
    bson_iter_value_cold_1();
    pbStack_460 = unaff_RBX;
    pcStack_458 = unaff_R12;
    if ((bson_json_reader_t *)iter == (bson_json_reader_t *)0x0) {
      bson_json_reader_read_cold_2();
    }
    else if ((bson_t *)dotkey != (bson_t *)0x0) {
      (((bson_json_reader_t *)iter)->bson).bson = (bson_t *)dotkey;
      (((bson_json_reader_t *)iter)->bson).n = -1;
      (((bson_json_reader_t *)iter)->bson).read_state = BSON_JSON_REGULAR;
      __s_00 = &bStack_660;
      if (error != (bson_error_t *)0x0) {
        __s_00 = error;
      }
      ((bson_json_reader_t *)iter)->error = __s_00;
      memset(__s_00,0,0x200);
      iVar29 = 0;
      while( true ) {
        sVar5 = ((bson_json_reader_t *)iter)->json->pos;
        nbytes = (((bson_json_reader_t *)iter)->producer).bytes_read;
        if (nbytes == 0) {
          nbytes = (*(((bson_json_reader_t *)iter)->producer).cb)
                             ((((bson_json_reader_t *)iter)->producer).data,
                              (((bson_json_reader_t *)iter)->producer).buf,
                              (((bson_json_reader_t *)iter)->producer).buf_size);
        }
        if ((long)nbytes < 0) {
          iVar29 = -1;
          if (error != (bson_error_t *)0x0) {
            bson_set_error(error,1,3,"reader cb failed");
          }
          goto LAB_00111fff;
        }
        if (nbytes == 0) goto LAB_00111fff;
        (((bson_json_reader_t *)iter)->producer).bytes_read = nbytes;
        jsonsl_feed(((bson_json_reader_t *)iter)->json,
                    (jsonsl_char_t *)(((bson_json_reader_t *)iter)->producer).buf,nbytes);
        if (((bson_json_reader_t *)iter)->should_reset == true) {
          jsonsl_reset(((bson_json_reader_t *)iter)->json);
          ((bson_json_reader_t *)iter)->should_reset = false;
          puVar33 = (((bson_json_reader_t *)iter)->producer).buf;
          memmove(puVar33,puVar33 + ((bson_json_reader_t *)iter)->advance,
                  nbytes - ((bson_json_reader_t *)iter)->advance);
          psVar2 = &(((bson_json_reader_t *)iter)->producer).bytes_read;
          *psVar2 = *psVar2 - ((bson_json_reader_t *)iter)->advance;
          iVar29 = 1;
          goto LAB_00111fff;
        }
        if (((bson_json_reader_t *)iter)->error->domain != 0) break;
        uVar28 = ((bson_json_reader_t *)iter)->json_text_pos;
        if ((uVar28 != 0xffffffffffffffff) &&
           (uVar6 = ((bson_json_reader_t *)iter)->json->pos, uVar22 = uVar6 - uVar28,
           uVar28 <= uVar6 && uVar22 != 0)) {
          if (uVar22 < nbytes) {
            nbytes = uVar22;
          }
          lVar26 = uVar28 - sVar5;
          if (lVar26 < 1) {
            lVar26 = 0;
          }
          _bson_json_buf_append
                    (&((bson_json_reader_t *)iter)->tok_accumulator,
                     (((bson_json_reader_t *)iter)->producer).buf + lVar26,nbytes);
        }
        (((bson_json_reader_t *)iter)->producer).bytes_read = 0;
        iVar29 = 1;
      }
      iVar29 = -1;
LAB_00111fff:
      if ((iVar29 == 1) && ((((bson_json_reader_t *)iter)->bson).read_state != BSON_JSON_DONE)) {
        _bson_json_read_corrupt((bson_json_reader_t *)iter,"%s","Incomplete JSON");
        iVar29 = -1;
      }
      return SUB41(iVar29,0);
    }
    bson_json_reader_read_cold_1();
    p_Var32 = (((bson_json_reader_t *)iter)->producer).dcb;
    if (p_Var32 == (bson_json_destroy_cb)0x0) {
      _bson_json_buf_ensure((bson_json_buf_t *)iter,__n + 1);
    }
    else if ((((bson_json_reader_t *)iter)->producer).cb < p_Var32 + __n + 1) {
      uVar28 = (ulong)(p_Var32 + __n) >> 1 | (ulong)(p_Var32 + __n);
      uVar28 = uVar28 >> 2 | uVar28;
      uVar28 = uVar28 >> 4 | uVar28;
      uVar28 = uVar28 >> 8 | uVar28;
      uVar28 = uVar28 >> 0x10 | uVar28;
      num_bytes = (bson_json_reader_cb)((uVar28 >> 0x20 | uVar28) + 1);
      (((bson_json_reader_t *)iter)->producer).cb = num_bytes;
      pvVar18 = bson_realloc((((bson_json_reader_t *)iter)->producer).data,(size_t)num_bytes);
      (((bson_json_reader_t *)iter)->producer).data = pvVar18;
    }
    memcpy((((bson_json_reader_t *)iter)->producer).dcb +
           (long)(((bson_json_reader_t *)iter)->producer).data,dotkey,__n);
    p_Var32 = (((bson_json_reader_t *)iter)->producer).dcb + __n;
    (((bson_json_reader_t *)iter)->producer).dcb = p_Var32;
    pvVar18 = (((bson_json_reader_t *)iter)->producer).data;
    p_Var32[(long)pvVar18] = (_func_void_void_ptr)0x0;
    return SUB81(pvVar18,0);
  }
  puVar33 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
  uVar37 = *(uint *)&(((bson_json_reader_t *)iter)->producer).dcb;
  bVar39 = puVar33[uVar37];
  ((bson_value_t *)&(((bson_json_reader_t *)iter)->producer).bytes_parsed)->value_type =
       (uint)bVar39;
  switch(bVar39) {
  case 1:
    dVar7 = bson_iter_double(iter);
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_double = dVar7;
    break;
  case 2:
    pcVar16 = bson_iter_utf8(iter,(uint32_t *)&((bson_json_reader_t *)iter)->field_0x40);
    goto LAB_00111e4c;
  case 3:
    bson_iter_document(iter,(uint32_t *)&((bson_json_reader_t *)iter)->field_0x40,
                       (uint8_t **)
                       &((anon_union_24_17_78d57918_for_value *)
                        &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_int64);
    break;
  case 4:
    bson_iter_array(iter,(uint32_t *)&((bson_json_reader_t *)iter)->field_0x40,
                    (uint8_t **)
                    &((anon_union_24_17_78d57918_for_value *)
                     &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_int64);
    break;
  case 5:
    bson_iter_binary(iter,(bson_subtype_t *)&((bson_json_reader_t *)iter)->field_0x44,
                     (uint32_t *)&((bson_json_reader_t *)iter)->field_0x40,
                     (uint8_t **)
                     &((anon_union_24_17_78d57918_for_value *)
                      &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_int64);
    break;
  case 6:
  case 10:
    break;
  case 7:
    pbVar21 = bson_iter_oid(iter);
    dst = (anon_union_24_17_78d57918_for_value *)
          &(((bson_json_reader_t *)iter)->producer).all_whitespace;
    goto LAB_00111da5;
  case 8:
    _Var11 = bson_iter_bool(iter);
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_bool = _Var11;
    break;
  case 9:
    pcVar16 = (char *)bson_iter_date_time(iter);
    goto LAB_00111e4c;
  case 0xb:
    pcVar16 = bson_iter_regex(iter,(char **)&((bson_json_reader_t *)iter)->field_0x40);
    goto LAB_00111e4c;
  case 0xc:
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_int64 = 0;
    pbVar21 = (bson_oid_t *)0x0;
    if (puVar33[uVar37] == '\f') {
      uVar37 = *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
      iVar29 = *(int *)(puVar33 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) + -1;
      if (*(int *)(puVar33 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) == 0) {
        iVar29 = 0;
      }
      *(int *)&((bson_json_reader_t *)iter)->field_0x40 = iVar29;
      (((anon_union_24_17_78d57918_for_value *)
       &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_utf8).str =
           (char *)(puVar33 + uVar37);
      pbVar21 = (bson_oid_t *)(puVar33 + (uint)(((bson_json_reader_t *)iter)->producer).buf_size);
    }
    dst = (anon_union_24_17_78d57918_for_value *)&((bson_json_reader_t *)iter)->field_0x44;
LAB_00111da5:
    bson_oid_copy(pbVar21,&dst->v_oid);
    break;
  case 0xd:
    if (puVar33[uVar37] == '\r') {
      iVar29 = 1;
      if (1 < *(int *)(puVar33 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)) {
        iVar29 = *(int *)(puVar33 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      }
      uVar37 = *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
      *(int *)&((bson_json_reader_t *)iter)->field_0x40 = iVar29 + -1;
      puVar27 = puVar33 + uVar37;
    }
    else {
      *(undefined4 *)&((bson_json_reader_t *)iter)->field_0x40 = 0;
      puVar27 = (uint8_t *)0x0;
    }
    goto LAB_00111e59;
  case 0xe:
    if (puVar33[uVar37] == '\x0e') {
      puVar27 = puVar33 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
      iVar29 = 1;
      if (1 < *(int *)(puVar33 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)) {
        iVar29 = *(int *)(puVar33 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      }
      iVar29 = iVar29 + -1;
    }
    else {
      puVar27 = (uint8_t *)0x0;
      iVar29 = 0;
    }
    *(int *)&((bson_json_reader_t *)iter)->field_0x40 = iVar29;
LAB_00111e59:
    (((anon_union_24_17_78d57918_for_value *)
     &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_utf8).str = (char *)puVar27;
    break;
  case 0xf:
    pcVar16 = bson_iter_codewscope
                        (iter,(uint32_t *)&((bson_json_reader_t *)iter)->field_0x48,
                         (uint32_t *)&((bson_json_reader_t *)iter)->field_0x4c,
                         (uint8_t **)&((bson_json_reader_t *)iter)->field_0x40);
    goto LAB_00111e4c;
  case 0x10:
    iVar31 = 0;
    if (puVar33[uVar37] == '\x10') {
      iVar31 = *(int32_t *)(puVar33 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
    }
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_int32 = iVar31;
    break;
  case 0x11:
    iVar31 = 0;
    uVar19 = 0;
    if (puVar33[uVar37] == '\x11') {
      uVar19 = *(undefined8 *)(puVar33 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      iVar31 = (int32_t)((ulong)uVar19 >> 0x20);
    }
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_int32 = iVar31;
    *(int *)&(((bson_json_reader_t *)iter)->producer).field_0x3c = (int)uVar19;
    break;
  case 0x12:
    if (puVar33[uVar37] == '\x12') {
      pcVar16 = *(char **)(puVar33 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
    }
    else {
      pcVar16 = (char *)0x0;
    }
LAB_00111e4c:
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_int64 = (int64_t)pcVar16;
    break;
  case 0x13:
    if (puVar33[uVar37] == '\x13') {
      iVar9 = *(int64_t *)
               ((long)(puVar33 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) + 8);
      ((anon_union_24_17_78d57918_for_value *)
      &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_int64 =
           *(int64_t *)(puVar33 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      *(int64_t *)&((bson_json_reader_t *)iter)->field_0x40 = iVar9;
    }
    break;
  default:
    if ((bVar39 != BSON_TYPE_MAXKEY) && (bVar39 != 0xff)) {
      return false;
    }
  }
  return (_Bool)((char)iter + '0');
}

Assistant:

bool
bson_iter_find_descendant (bson_iter_t *iter,       /* INOUT */
                           const char *dotkey,      /* IN */
                           bson_iter_t *descendant) /* OUT */
{
   bson_iter_t tmp;
   const char *dot;
   size_t sublen;

   BSON_ASSERT (iter);
   BSON_ASSERT (dotkey);
   BSON_ASSERT (descendant);

   if ((dot = strchr (dotkey, '.'))) {
      sublen = dot - dotkey;
   } else {
      sublen = strlen (dotkey);
   }

   if (_bson_iter_find_with_len (iter, dotkey, (int) sublen)) {
      if (!dot) {
         *descendant = *iter;
         return true;
      }

      if (BSON_ITER_HOLDS_DOCUMENT (iter) || BSON_ITER_HOLDS_ARRAY (iter)) {
         if (bson_iter_recurse (iter, &tmp)) {
            return bson_iter_find_descendant (&tmp, dot + 1, descendant);
         }
      }
   }

   return false;
}